

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxlen.cc
# Opt level: O2

void __thiscall re2c::Node::calc_dist(Node *this)

{
  bool bVar1;
  uint uVar2;
  _Base_ptr p_Var3;
  uint uVar4;
  uint uVar5;
  
  if (this->dist == 0xffffffff) {
    bVar1 = end(this);
    if (bVar1) {
      this->dist = 0;
    }
    else if (this->loop < 2) {
      this->loop = this->loop + 1;
      for (p_Var3 = (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(this->arcs)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        calc_dist(*(Node **)(p_Var3 + 1));
        uVar4 = *(uint *)(*(long *)(p_Var3 + 1) + 0x70);
        if (uVar4 != 0xffffffff) {
          uVar2 = this->dist;
          uVar5 = uVar4;
          if (uVar4 < uVar2) {
            uVar5 = uVar2;
          }
          if (uVar2 == 0xffffffff) {
            uVar5 = uVar4;
          }
          this->dist = uVar5;
        }
      }
      uVar2 = this->dist + 1;
      uVar4 = 0xfffffffe;
      if (uVar2 < 0xfffffffe) {
        uVar4 = uVar2;
      }
      this->dist = uVar4;
      this->loop = this->loop + 0xff;
    }
  }
  return;
}

Assistant:

void Node::calc_dist ()
{
	if (dist != DIST_ERROR)
	{
		return;
	}
	else if (end ())
	{
		dist = 0;
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin (); i != arcs.end (); ++i)
		{
			i->first->calc_dist ();
			if (i->first->dist != DIST_ERROR)
			{
				if (dist == DIST_ERROR)
				{
					dist = i->first->dist;
				}
				else
				{
					dist = std::max (dist, i->first->dist);
				}
			}
		}
		dist = std::min (dist + 1, DIST_MAX);
	}
}